

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

VertexId __thiscall
S2Builder::EdgeChainSimplifier::FollowChain(EdgeChainSimplifier *this,VertexId v0,VertexId v1)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  pointer piVar4;
  pointer ppVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  S2LogMessage SStack_18;
  
  uVar7 = (ulong)v1;
  uVar8 = uVar7 + 0x3f;
  if (-1 < (long)uVar7) {
    uVar8 = uVar7;
  }
  if (((this->is_interior_).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
       [((long)uVar8 >> 6) +
        (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
       (uVar7 & 0x3f) & 1) == 0) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0x63c,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: is_interior_[v1] ",0x1f);
  }
  else {
    piVar4 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = piVar4[uVar7];
    uVar2 = piVar4[uVar7 + 1];
    bVar10 = uVar1 == uVar2;
    iVar6 = v1;
    if (!bVar10) {
      ppVar5 = (this->g_->edges_->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      iVar3 = ppVar5[(int)uVar1].second;
      iVar6 = iVar3;
      if (iVar3 == v0 || iVar3 == v1) {
        lVar9 = 0;
        do {
          bVar10 = ~uVar1 + uVar2 == (int)lVar9;
          iVar6 = iVar3;
          if (bVar10) break;
          iVar6 = ppVar5[(long)(int)uVar1 + lVar9 + 1].second;
          lVar9 = lVar9 + 1;
        } while (iVar6 == v1 || iVar6 == v0);
      }
    }
    if (!bVar10) {
      return iVar6;
    }
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0x641,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,"Could not find next edge in edge chain");
  }
  abort();
}

Assistant:

S2Builder::Graph::VertexId S2Builder::EdgeChainSimplifier::FollowChain(
    VertexId v0, VertexId v1) const {
  S2_DCHECK(is_interior_[v1]);
  for (EdgeId e : out_.edge_ids(v1)) {
    VertexId v = g_.edge(e).second;
    if (v != v0 && v != v1) return v;
  }
  S2_LOG(FATAL) << "Could not find next edge in edge chain";
}